

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O3

void rmlLinkedListEach(void *self,rmlLinkedListEachCallback callback,void *attachment)

{
  _Bool _Var1;
  long lVar2;
  undefined8 *puVar3;
  rmlLinkedListEachCallbackContext context;
  rmlLinkedListEachCallbackContext local_48;
  
  puVar3 = *self;
  if (puVar3 != (undefined8 *)0x0 && callback != (rmlLinkedListEachCallback)0x0) {
    lVar2 = 0;
    local_48.attachment = attachment;
    local_48.linkedList = self;
    do {
      local_48.value = (void *)*puVar3;
      local_48.valueItem = puVar3;
      local_48.index = lVar2;
      _Var1 = (*callback)(&local_48);
      if (_Var1) {
        return;
      }
      lVar2 = lVar2 + 1;
      puVar3 = (undefined8 *)puVar3[2];
    } while (puVar3 != (undefined8 *)0x0);
  }
  return;
}

Assistant:

void rmlLinkedListEach(void *self, rmlLinkedListEachCallback callback, void *attachment) {
    struct rmlLinkedList *selfList = self;
    rmlLinkedListEachCallbackContext context;
    context.linkedList = selfList;
    context.attachment = attachment;
    int64_t index = 0;
    for (struct rmlLinkedListItem *current = selfList->head_; current != NULL; current = current->next_) {
        if (callback == NULL) {
            break;
        }

        context.valueItem = current;
        context.value = current->value_;
        context.index = index;
        if (callback(&context)) {
            break;
        }
        index++;
    }
}